

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

Node * __thiscall Parser::identifier(Parser *this)

{
  Token *this_00;
  Node *this_01;
  string local_70;
  string variable_str;
  string local_30;
  
  eat_abi_cxx11_(&local_30,this,IDENTIFIER);
  std::__cxx11::string::~string((string *)&local_30);
  this_00 = Lexer::current_token(this->lex);
  Token::get_lexeme_abi_cxx11_(&variable_str,this_00);
  Lexer::next_token(this->lex);
  this_01 = (Node *)operator_new(0x48);
  std::__cxx11::string::string((string *)&local_70,(string *)&variable_str);
  Node::Node(this_01,VARIABLE,(Node *)0x0,(Node *)0x0,&local_70,(Node *)0x0,(Node *)0x0);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&variable_str);
  return this_01;
}

Assistant:

Node* Parser::identifier()
{
	eat(token_type::IDENTIFIER);

	string variable_str = lex->current_token()->get_lexeme();
	lex->next_token();

	Node* identifier_node = new Node(node_type::VARIABLE, nullptr, nullptr, variable_str);
	return identifier_node;
}